

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O2

void __thiscall
gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::emplace_back<int&>
          (rcu_list<int,std::mutex,std::allocator<int>> *this,int *vs)

{
  __pointer_type pnVar1;
  _Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
  _Var2;
  int *in_RCX;
  unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  newNode;
  unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  uStack_28;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x18))->__data);
  detail::
  allocate_unique<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node,std::allocator<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node>,int&>
            (&uStack_28,(detail *)(this + 0x40),
             (allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node> *)
             vs,in_RCX);
  _Var2._M_head_impl =
       uStack_28._M_t.
       super___uniq_ptr_impl<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
       .
       super__Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
       ._M_head_impl;
  pnVar1 = *(__pointer_type *)(this + 8);
  if (pnVar1 == (__pointer_type)0x0) {
    LOCK();
    *(node **)this =
         uStack_28._M_t.
         super___uniq_ptr_impl<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
         .
         super__Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
         ._M_head_impl;
    UNLOCK();
  }
  else {
    LOCK();
    ((uStack_28._M_t.
      super___uniq_ptr_impl<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
      .
      super__Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
     ._M_head_impl)->back)._M_b._M_p = pnVar1;
    UNLOCK();
    LOCK();
    (pnVar1->next)._M_b._M_p =
         uStack_28._M_t.
         super___uniq_ptr_impl<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
         .
         super__Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
         ._M_head_impl;
    UNLOCK();
  }
  uStack_28._M_t.
  super___uniq_ptr_impl<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  .
  super__Head_base<0UL,_gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*,_false>
  ._M_head_impl = (node *)0x0;
  LOCK();
  *(node **)(this + 8) = _Var2._M_head_impl;
  UNLOCK();
  std::
  unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
  ::~unique_ptr(&uStack_28);
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x18));
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::emplace_back(Us&&... vs)
{
    std::lock_guard<M> guard(m_write_mutex);
    auto newNode =
        detail::allocate_unique<node>(m_node_alloc, std::forward<Us>(vs)...);

    node* oldTail = m_tail.load(std::memory_order_relaxed);

    if (oldTail == nullptr) {
        m_head.store(newNode.get());
        m_tail.store(newNode.release());
    } else {
        newNode->back.store(oldTail);
        oldTail->next.store(newNode.get());
        m_tail.store(newNode.release());
    }
}